

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O0

bool Catch::shouldShowDuration(IConfig *config,double duration)

{
  int iVar1;
  double extraout_XMM0_Qa;
  bool local_29;
  double min;
  double duration_local;
  IConfig *config_local;
  
  iVar1 = (*(config->super_NonCopyable)._vptr_NonCopyable[0xb])();
  if (iVar1 == 1) {
    config_local._7_1_ = true;
  }
  else {
    iVar1 = (*(config->super_NonCopyable)._vptr_NonCopyable[0xb])();
    if (iVar1 == 2) {
      config_local._7_1_ = false;
    }
    else {
      (*(config->super_NonCopyable)._vptr_NonCopyable[0xc])();
      local_29 = 0.0 <= extraout_XMM0_Qa && extraout_XMM0_Qa <= duration;
      config_local._7_1_ = local_29;
    }
  }
  return config_local._7_1_;
}

Assistant:

bool shouldShowDuration( IConfig const& config, double duration ) {
        if ( config.showDurations() == ShowDurations::Always ) {
            return true;
        }
        if ( config.showDurations() == ShowDurations::Never ) {
            return false;
        }
        const double min = config.minDuration();
        return min >= 0 && duration >= min;
    }